

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSynch.c
# Opt level: O0

Aig_Man_t * Saig_ManDupInitZero(Aig_Man_t *p)

{
  Vec_Ptr_t *pVVar1;
  int iVar2;
  int iVar3;
  Aig_Man_t *p_00;
  char *pcVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  void *pvVar7;
  Aig_Obj_t *p1;
  int local_24;
  int i;
  Aig_Obj_t *pObj;
  Aig_Man_t *pNew;
  Aig_Man_t *p_local;
  
  iVar2 = Aig_ManObjNumMax(p);
  p_00 = Aig_ManStart(iVar2);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar4;
  pAVar5 = Aig_ManConst1(p_00);
  pAVar6 = Aig_ManConst1(p);
  (pAVar6->field_5).pData = pAVar5;
  for (local_24 = 0; iVar2 = Saig_ManPiNum(p), local_24 < iVar2; local_24 = local_24 + 1) {
    pvVar7 = Vec_PtrEntry(p->vCis,local_24);
    pAVar5 = Aig_ObjCreateCi(p_00);
    *(Aig_Obj_t **)((long)pvVar7 + 0x28) = pAVar5;
  }
  for (local_24 = 0; iVar2 = Saig_ManRegNum(p), local_24 < iVar2; local_24 = local_24 + 1) {
    pVVar1 = p->vCis;
    iVar2 = Saig_ManPiNum(p);
    pvVar7 = Vec_PtrEntry(pVVar1,local_24 + iVar2);
    pAVar5 = Aig_ObjCreateCi(p_00);
    pAVar5 = Aig_NotCond(pAVar5,(uint)(*(ulong *)((long)pvVar7 + 0x18) >> 4) & 1);
    *(Aig_Obj_t **)((long)pvVar7 + 0x28) = pAVar5;
  }
  for (local_24 = 0; iVar2 = Vec_PtrSize(p->vObjs), local_24 < iVar2; local_24 = local_24 + 1) {
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_24);
    if ((pAVar5 != (Aig_Obj_t *)0x0) && (iVar2 = Aig_ObjIsNode(pAVar5), iVar2 != 0)) {
      pAVar6 = Aig_ObjChild0Copy(pAVar5);
      p1 = Aig_ObjChild1Copy(pAVar5);
      pAVar6 = Aig_And(p_00,pAVar6,p1);
      (pAVar5->field_5).pData = pAVar6;
    }
  }
  for (local_24 = 0; iVar2 = Saig_ManPoNum(p), local_24 < iVar2; local_24 = local_24 + 1) {
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,local_24);
    pAVar6 = Aig_ObjChild0Copy(pAVar5);
    pAVar6 = Aig_ObjCreateCo(p_00,pAVar6);
    (pAVar5->field_5).pData = pAVar6;
  }
  for (local_24 = 0; iVar2 = Saig_ManRegNum(p), local_24 < iVar2; local_24 = local_24 + 1) {
    pVVar1 = p->vCos;
    iVar2 = Saig_ManPoNum(p);
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pVVar1,local_24 + iVar2);
    pAVar6 = Aig_ObjChild0Copy(pAVar5);
    pAVar6 = Aig_NotCond(pAVar6,(uint)(*(ulong *)&pAVar5->field_0x18 >> 4) & 1);
    pAVar6 = Aig_ObjCreateCo(p_00,pAVar6);
    (pAVar5->field_5).pData = pAVar6;
  }
  iVar2 = Saig_ManRegNum(p);
  Aig_ManSetRegNum(p_00,iVar2);
  iVar2 = Aig_ManNodeNum(p_00);
  iVar3 = Aig_ManNodeNum(p);
  if (iVar2 == iVar3) {
    return p_00;
  }
  __assert_fail("Aig_ManNodeNum(pNew) == Aig_ManNodeNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigSynch.c"
                ,0x1e7,"Aig_Man_t *Saig_ManDupInitZero(Aig_Man_t *)");
}

Assistant:

Aig_Man_t * Saig_ManDupInitZero( Aig_Man_t * p )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj;
    int i;
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Saig_ManForEachPi( p, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pNew );
    Saig_ManForEachLo( p, pObj, i )
        pObj->pData = Aig_NotCond( Aig_ObjCreateCi( pNew ), pObj->fMarkA );
    Aig_ManForEachNode( p, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    Saig_ManForEachPo( p, pObj, i )
        pObj->pData = Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    Saig_ManForEachLi( p, pObj, i )
        pObj->pData = Aig_ObjCreateCo( pNew, Aig_NotCond( Aig_ObjChild0Copy(pObj), pObj->fMarkA ) );
    Aig_ManSetRegNum( pNew, Saig_ManRegNum(p) );
    assert( Aig_ManNodeNum(pNew) == Aig_ManNodeNum(p) );
    return pNew;
}